

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void MIR_gen_finish(MIR_context_t ctx)

{
  gen_ctx *__ptr;
  ssa_ctx *psVar1;
  VARR_HTAB_EL_def_tab_el_t *__ptr_00;
  VARR_ssa_edge_t *__ptr_01;
  VARR_char *__ptr_02;
  gvn_ctx *pgVar2;
  VARR_expr_t *__ptr_03;
  VARR_HTAB_EL_expr_t *__ptr_04;
  VARR_mem_expr_t *__ptr_05;
  VARR_HTAB_EL_mem_expr_t *__ptr_06;
  VARR_insn_nop_pair_t *__ptr_07;
  VARR_live_range_t *__ptr_08;
  live_range_t_conflict __ptr_09;
  lr_bb_t_conflict __ptr_10;
  coalesce_ctx *pcVar3;
  VARR_mv_t *__ptr_11;
  ra_ctx *prVar4;
  VARR_allocno_info_t *__ptr_12;
  VARR_spill_el_t *__ptr_13;
  VARR_HTAB_EL_lr_gap_t *__ptr_14;
  VARR_spill_cache_el_t *__ptr_15;
  combine_ctx *pcVar5;
  VARR_var_ref_t *__ptr_16;
  target_ctx *ptVar6;
  VARR_insn_pattern_info_t *__ptr_17;
  VARR_uint8_t *__ptr_18;
  VARR_const_ref_t *__ptr_19;
  VARR_label_ref_t *__ptr_20;
  VARR_MIR_code_reloc_t *__ptr_21;
  VARR_call_ref_t *__ptr_22;
  dead_var_t_conflict elem;
  VARR_mem_attr_t *__ptr_23;
  VARR_target_bb_version_t *__ptr_24;
  VARR_void_ptr_t *pVVar7;
  size_t sVar8;
  bitmap_t pVVar9;
  lr_ctx *plVar10;
  VARR_bitmap_t **ppVVar11;
  char *op;
  HTAB_def_tab_el_t *htab;
  HTAB_expr_t *htab_00;
  HTAB_mem_expr_t *htab_01;
  long lVar12;
  HTAB_lr_gap_t *htab_02;
  
  __ptr = ctx->gen_ctx;
  if (__ptr == (gen_ctx *)0x0) {
    fwrite("Calling MIR_gen_finish before MIR_gen_init -- good bye\n",0x37,1,_stderr);
    exit(1);
  }
  VARR_bb_tdestroy(&__ptr->data_flow_ctx->worklist);
  VARR_bb_tdestroy(&__ptr->data_flow_ctx->pending);
  bitmap_destroy(__ptr->data_flow_ctx->bb_to_consider);
  free(__ptr->data_flow_ctx);
  __ptr->data_flow_ctx = (data_flow_ctx *)0x0;
  VARR_bb_insn_tdestroy(&__ptr->ssa_ctx->arg_bb_insns);
  VARR_bb_insn_tdestroy(&__ptr->ssa_ctx->undef_insns);
  VARR_bb_insn_tdestroy(&__ptr->ssa_ctx->phis);
  VARR_bb_insn_tdestroy(&__ptr->ssa_ctx->deleted_phis);
  psVar1 = __ptr->ssa_ctx;
  htab = psVar1->def_tab;
  if (htab->free_func != (_func_void_def_tab_el_t_void_ptr *)0x0) {
    HTAB_def_tab_el_t_clear(htab);
    htab = psVar1->def_tab;
  }
  __ptr_00 = htab->els;
  if ((__ptr_00 == (VARR_HTAB_EL_def_tab_el_t *)0x0) ||
     (__ptr_00->varr == (HTAB_EL_def_tab_el_t *)0x0)) {
    mir_varr_assert_fail("destroy","HTAB_EL_def_tab_el_t");
  }
  free(__ptr_00->varr);
  free(__ptr_00);
  htab->els = (VARR_HTAB_EL_def_tab_el_t *)0x0;
  VARR_htab_ind_tdestroy(&psVar1->def_tab->entries);
  free(psVar1->def_tab);
  psVar1->def_tab = (HTAB_def_tab_el_t *)0x0;
  psVar1 = __ptr->ssa_ctx;
  __ptr_01 = psVar1->ssa_edges_to_process;
  if ((__ptr_01 == (VARR_ssa_edge_t *)0x0) || (__ptr_01->varr == (ssa_edge_t_conflict *)0x0)) {
    mir_varr_assert_fail("destroy","ssa_edge_t");
  }
  free(__ptr_01->varr);
  free(__ptr_01);
  psVar1->ssa_edges_to_process = (VARR_ssa_edge_t *)0x0;
  VARR_size_tdestroy(&__ptr->ssa_ctx->curr_reg_indexes);
  psVar1 = __ptr->ssa_ctx;
  __ptr_02 = psVar1->reg_name;
  if ((__ptr_02 == (VARR_char *)0x0) || (__ptr_02->varr == (char *)0x0)) {
    mir_varr_assert_fail("destroy","char");
  }
  free(__ptr_02->varr);
  free(__ptr_02);
  psVar1->reg_name = (VARR_char *)0x0;
  free(__ptr->ssa_ctx);
  __ptr->ssa_ctx = (ssa_ctx *)0x0;
  pgVar2 = __ptr->gvn_ctx;
  __ptr_03 = pgVar2->exprs;
  if ((__ptr_03 == (VARR_expr_t *)0x0) || (__ptr_03->varr == (expr_t *)0x0)) {
    mir_varr_assert_fail("destroy","expr_t");
  }
  free(__ptr_03->varr);
  free(__ptr_03);
  pgVar2->exprs = (VARR_expr_t *)0x0;
  pgVar2 = __ptr->gvn_ctx;
  htab_00 = pgVar2->expr_tab;
  if (htab_00->free_func != (_func_void_expr_t_void_ptr *)0x0) {
    HTAB_expr_t_clear(htab_00);
    htab_00 = pgVar2->expr_tab;
  }
  __ptr_04 = htab_00->els;
  if ((__ptr_04 == (VARR_HTAB_EL_expr_t *)0x0) || (__ptr_04->varr == (HTAB_EL_expr_t *)0x0)) {
    mir_varr_assert_fail("destroy","HTAB_EL_expr_t");
  }
  free(__ptr_04->varr);
  free(__ptr_04);
  htab_00->els = (VARR_HTAB_EL_expr_t *)0x0;
  VARR_htab_ind_tdestroy(&pgVar2->expr_tab->entries);
  free(pgVar2->expr_tab);
  pgVar2->expr_tab = (HTAB_expr_t *)0x0;
  free(__ptr->gvn_ctx->temp_mem_insn);
  pgVar2 = __ptr->gvn_ctx;
  __ptr_05 = pgVar2->mem_exprs;
  if ((__ptr_05 == (VARR_mem_expr_t *)0x0) || (__ptr_05->varr == (mem_expr_t *)0x0)) {
    mir_varr_assert_fail("destroy","mem_expr_t");
  }
  free(__ptr_05->varr);
  free(__ptr_05);
  pgVar2->mem_exprs = (VARR_mem_expr_t *)0x0;
  pgVar2 = __ptr->gvn_ctx;
  htab_01 = pgVar2->mem_expr_tab;
  if (htab_01->free_func != (_func_void_mem_expr_t_void_ptr *)0x0) {
    HTAB_mem_expr_t_clear(htab_01);
    htab_01 = pgVar2->mem_expr_tab;
  }
  __ptr_06 = htab_01->els;
  if ((__ptr_06 == (VARR_HTAB_EL_mem_expr_t *)0x0) || (__ptr_06->varr == (HTAB_EL_mem_expr_t *)0x0))
  {
    mir_varr_assert_fail("destroy","HTAB_EL_mem_expr_t");
  }
  free(__ptr_06->varr);
  free(__ptr_06);
  htab_01->els = (VARR_HTAB_EL_mem_expr_t *)0x0;
  VARR_htab_ind_tdestroy(&pgVar2->mem_expr_tab->entries);
  free(pgVar2->mem_expr_tab);
  pgVar2->mem_expr_tab = (HTAB_mem_expr_t *)0x0;
  pgVar2 = __ptr->gvn_ctx;
  __ptr_07 = pgVar2->insn_nop_pairs;
  if ((__ptr_07 == (VARR_insn_nop_pair_t *)0x0) || (__ptr_07->varr == (insn_nop_pair_t *)0x0)) {
    mir_varr_assert_fail("destroy","insn_nop_pair_t");
  }
  free(__ptr_07->varr);
  free(__ptr_07);
  pgVar2->insn_nop_pairs = (VARR_insn_nop_pair_t *)0x0;
  free(__ptr->gvn_ctx);
  __ptr->gvn_ctx = (gvn_ctx *)0x0;
  plVar10 = __ptr->lr_ctx;
  __ptr_08 = plVar10->var_live_ranges;
  if ((__ptr_08 == (VARR_live_range_t *)0x0) || (__ptr_08->varr == (live_range_t_conflict *)0x0)) {
    mir_varr_assert_fail("destroy","live_range_t");
  }
  free(__ptr_08->varr);
  free(__ptr_08);
  plVar10->var_live_ranges = (VARR_live_range_t *)0x0;
  VARR_intdestroy(&__ptr->lr_ctx->point_map);
  bitmap_destroy(__ptr->lr_ctx->live_vars);
  bitmap_destroy(__ptr->lr_ctx->referenced_vars);
  bitmap_destroy(__ptr->lr_ctx->points_with_born_vars);
  bitmap_destroy(__ptr->lr_ctx->points_with_dead_vars);
  bitmap_destroy(__ptr->lr_ctx->points_with_born_or_dead_vars);
  while( true ) {
    plVar10 = __ptr->lr_ctx;
    __ptr_09 = plVar10->free_lr_list;
    if (__ptr_09 == (live_range_t_conflict)0x0) break;
    plVar10->free_lr_list = __ptr_09->next;
    free(__ptr_09);
  }
  while (__ptr_10 = plVar10->free_lr_bb_list, __ptr_10 != (lr_bb_t_conflict)0x0) {
    plVar10->free_lr_bb_list = __ptr_10->next;
    free(__ptr_10);
    plVar10 = __ptr->lr_ctx;
  }
  VARR_intdestroy(&plVar10->var_to_scan_var_map);
  VARR_MIR_reg_tdestroy(&__ptr->lr_ctx->scan_var_to_var_map);
  free(__ptr->lr_ctx);
  __ptr->lr_ctx = (lr_ctx *)0x0;
  pcVar3 = __ptr->coalesce_ctx;
  __ptr_11 = pcVar3->moves;
  if ((__ptr_11 == (VARR_mv_t *)0x0) || (__ptr_11->varr == (mv_t *)0x0)) {
    mir_varr_assert_fail("destroy","mv_t");
  }
  free(__ptr_11->varr);
  free(__ptr_11);
  pcVar3->moves = (VARR_mv_t *)0x0;
  VARR_MIR_reg_tdestroy(&__ptr->coalesce_ctx->first_coalesced_reg);
  VARR_MIR_reg_tdestroy(&__ptr->coalesce_ctx->next_coalesced_reg);
  bitmap_destroy(__ptr->coalesce_ctx->conflict_matrix);
  free(__ptr->coalesce_ctx);
  __ptr->coalesce_ctx = (coalesce_ctx *)0x0;
  VARR_MIR_reg_tdestroy(&__ptr->ra_ctx->reg_renumber);
  prVar4 = __ptr->ra_ctx;
  __ptr_12 = prVar4->sorted_regs;
  if ((__ptr_12 == (VARR_allocno_info_t *)0x0) || (__ptr_12->varr == (allocno_info_t *)0x0)) {
    mir_varr_assert_fail("destroy","allocno_info_t");
  }
  free(__ptr_12->varr);
  free(__ptr_12);
  prVar4->sorted_regs = (VARR_allocno_info_t *)0x0;
  while( true ) {
    sVar8 = VARR_bitmap_tlength(__ptr->ra_ctx->used_locs);
    ppVVar11 = &__ptr->ra_ctx->used_locs;
    if (sVar8 == 0) break;
    pVVar9 = VARR_bitmap_tpop(*ppVVar11);
    bitmap_destroy(pVVar9);
  }
  VARR_bitmap_tdestroy(ppVVar11);
  while( true ) {
    sVar8 = VARR_bitmap_tlength(__ptr->ra_ctx->busy_used_locs);
    ppVVar11 = &__ptr->ra_ctx->busy_used_locs;
    if (sVar8 == 0) break;
    pVVar9 = VARR_bitmap_tpop(*ppVVar11);
    bitmap_destroy(pVVar9);
  }
  VARR_bitmap_tdestroy(ppVVar11);
  while( true ) {
    sVar8 = VARR_bitmap_tlength(__ptr->ra_ctx->var_bbs);
    ppVVar11 = &__ptr->ra_ctx->var_bbs;
    if (sVar8 == 0) break;
    pVVar9 = VARR_bitmap_tpop(*ppVVar11);
    bitmap_destroy(pVVar9);
  }
  VARR_bitmap_tdestroy(ppVVar11);
  VARR_lr_gap_tdestroy(&__ptr->ra_ctx->spill_gaps);
  VARR_lr_gap_tdestroy(&__ptr->ra_ctx->curr_gaps);
  prVar4 = __ptr->ra_ctx;
  __ptr_13 = prVar4->spill_els;
  if ((__ptr_13 == (VARR_spill_el_t *)0x0) || (__ptr_13->varr == (spill_el_t *)0x0)) {
    mir_varr_assert_fail("destroy","spill_el_t");
  }
  free(__ptr_13->varr);
  free(__ptr_13);
  prVar4->spill_els = (VARR_spill_el_t *)0x0;
  for (lVar12 = 8; prVar4 = __ptr->ra_ctx, lVar12 != 0x2a; lVar12 = lVar12 + 1) {
    if (prVar4->lr_gap_bitmaps[lVar12 + -8] != (bitmap_t)0x0) {
      bitmap_destroy(prVar4->lr_gap_bitmaps[lVar12 + -8]);
    }
  }
  htab_02 = prVar4->lr_gap_tab;
  if (htab_02->free_func != (_func_void_lr_gap_t_void_ptr *)0x0) {
    HTAB_lr_gap_t_clear(htab_02);
    htab_02 = prVar4->lr_gap_tab;
  }
  __ptr_14 = htab_02->els;
  if ((__ptr_14 == (VARR_HTAB_EL_lr_gap_t *)0x0) || (__ptr_14->varr == (HTAB_EL_lr_gap_t *)0x0)) {
    mir_varr_assert_fail("destroy","HTAB_EL_lr_gap_t");
  }
  free(__ptr_14->varr);
  free(__ptr_14);
  htab_02->els = (VARR_HTAB_EL_lr_gap_t *)0x0;
  VARR_htab_ind_tdestroy(&prVar4->lr_gap_tab->entries);
  free(prVar4->lr_gap_tab);
  prVar4->lr_gap_tab = (HTAB_lr_gap_t *)0x0;
  prVar4 = __ptr->ra_ctx;
  __ptr_15 = prVar4->spill_cache;
  if ((__ptr_15 == (VARR_spill_cache_el_t *)0x0) || (__ptr_15->varr == (spill_cache_el_t *)0x0)) {
    mir_varr_assert_fail("destroy","spill_cache_el_t");
  }
  free(__ptr_15->varr);
  free(__ptr_15);
  prVar4->spill_cache = (VARR_spill_cache_el_t *)0x0;
  bitmap_destroy(__ptr->ra_ctx->conflict_locs1);
  free(__ptr->ra_ctx);
  __ptr->ra_ctx = (ra_ctx *)0x0;
  VARR_size_tdestroy(&__ptr->combine_ctx->var_ref_ages);
  pcVar5 = __ptr->combine_ctx;
  __ptr_16 = pcVar5->var_refs;
  if ((__ptr_16 == (VARR_var_ref_t *)0x0) || (__ptr_16->varr == (var_ref_t *)0x0)) {
    mir_varr_assert_fail("destroy","var_ref_t");
  }
  free(__ptr_16->varr);
  free(__ptr_16);
  pcVar5->var_refs = (VARR_var_ref_t *)0x0;
  VARR_MIR_reg_tdestroy(&__ptr->combine_ctx->insn_vars);
  VARR_size_tdestroy(&__ptr->combine_ctx->changed_op_numbers);
  VARR_MIR_op_tdestroy(&__ptr->combine_ctx->last_right_ops);
  bitmap_destroy(__ptr->combine_ctx->vars_bitmap);
  free(__ptr->combine_ctx);
  __ptr->combine_ctx = (combine_ctx *)0x0;
  for (lVar12 = 0xd; lVar12 != 0x20; lVar12 = lVar12 + 1) {
    bitmap_destroy(__ptr->call_used_hard_regs[lVar12 + -0xd]);
  }
  bitmap_destroy(__ptr->tied_regs);
  bitmap_destroy(__ptr->addr_regs);
  bitmap_destroy(__ptr->insn_to_consider);
  bitmap_destroy(__ptr->func_used_hard_regs);
  VARR_intdestroy(&__ptr->target_ctx->pattern_indexes);
  ptVar6 = __ptr->target_ctx;
  __ptr_17 = ptVar6->insn_pattern_info;
  if ((__ptr_17 == (VARR_insn_pattern_info_t *)0x0) ||
     (__ptr_17->varr == (insn_pattern_info_t *)0x0)) {
    mir_varr_assert_fail("destroy","insn_pattern_info_t");
  }
  free(__ptr_17->varr);
  free(__ptr_17);
  ptVar6->insn_pattern_info = (VARR_insn_pattern_info_t *)0x0;
  _MIR_free_insn(__ptr->ctx,__ptr->target_ctx->temp_jump);
  ptVar6 = __ptr->target_ctx;
  __ptr_18 = ptVar6->result_code;
  if ((__ptr_18 == (VARR_uint8_t *)0x0) || (__ptr_18->varr == (uint8_t *)0x0)) {
    mir_varr_assert_fail("destroy","uint8_t");
  }
  free(__ptr_18->varr);
  free(__ptr_18);
  ptVar6->result_code = (VARR_uint8_t *)0x0;
  VARR_intdestroy(&__ptr->target_ctx->insn_pattern_indexes);
  VARR_uint64_tdestroy(&__ptr->target_ctx->const_pool);
  ptVar6 = __ptr->target_ctx;
  __ptr_19 = ptVar6->const_refs;
  if ((__ptr_19 == (VARR_const_ref_t *)0x0) || (__ptr_19->varr == (const_ref_t *)0x0)) {
    mir_varr_assert_fail("destroy","const_ref_t");
  }
  free(__ptr_19->varr);
  free(__ptr_19);
  ptVar6->const_refs = (VARR_const_ref_t *)0x0;
  ptVar6 = __ptr->target_ctx;
  __ptr_20 = ptVar6->label_refs;
  if ((__ptr_20 == (VARR_label_ref_t *)0x0) || (__ptr_20->varr == (label_ref_t *)0x0)) {
    mir_varr_assert_fail("destroy","label_ref_t");
  }
  free(__ptr_20->varr);
  free(__ptr_20);
  ptVar6->label_refs = (VARR_label_ref_t *)0x0;
  VARR_uint64_tdestroy(&__ptr->target_ctx->abs_address_locs);
  ptVar6 = __ptr->target_ctx;
  __ptr_21 = ptVar6->relocs;
  if ((__ptr_21 == (VARR_MIR_code_reloc_t *)0x0) || (__ptr_21->varr == (MIR_code_reloc_t *)0x0)) {
    mir_varr_assert_fail("destroy","MIR_code_reloc_t");
  }
  free(__ptr_21->varr);
  free(__ptr_21);
  ptVar6->relocs = (VARR_MIR_code_reloc_t *)0x0;
  ptVar6 = __ptr->target_ctx;
  __ptr_22 = ptVar6->call_refs;
  if ((__ptr_22 == (VARR_call_ref_t *)0x0) || (__ptr_22->varr == (call_ref_t *)0x0)) {
    mir_varr_assert_fail("destroy","call_ref_t");
  }
  free(__ptr_22->varr);
  free(__ptr_22);
  ptVar6->call_refs = (VARR_call_ref_t *)0x0;
  free(__ptr->target_ctx);
  __ptr->target_ctx = (target_ctx *)0x0;
  while (elem = (__ptr->free_dead_vars).head, elem != (dead_var_t_conflict)0x0) {
    DLIST_dead_var_t_remove(&__ptr->free_dead_vars,elem);
    free(elem);
  }
  free(__ptr->data_flow_ctx);
  bitmap_destroy(__ptr->temp_bitmap);
  bitmap_destroy(__ptr->temp_bitmap2);
  bitmap_destroy(__ptr->temp_bitmap3);
  VARR_MIR_op_tdestroy(&__ptr->temp_ops);
  VARR_MIR_insn_tdestroy(&__ptr->temp_insns);
  VARR_MIR_insn_tdestroy(&__ptr->temp_insns2);
  VARR_bb_insn_tdestroy(&__ptr->temp_bb_insns);
  VARR_bb_insn_tdestroy(&__ptr->temp_bb_insns2);
  VARR_loop_node_tdestroy(&__ptr->loop_nodes);
  VARR_loop_node_tdestroy(&__ptr->queue_nodes);
  VARR_loop_node_tdestroy(&__ptr->loop_entries);
  __ptr_23 = __ptr->mem_attrs;
  if ((__ptr_23 == (VARR_mem_attr_t *)0x0) || (__ptr_23->varr == (mem_attr_t *)0x0)) {
    mir_varr_assert_fail("destroy","mem_attr_t");
  }
  free(__ptr_23->varr);
  free(__ptr_23);
  __ptr->mem_attrs = (VARR_mem_attr_t *)0x0;
  __ptr_24 = __ptr->target_succ_bb_versions;
  if ((__ptr_24 == (VARR_target_bb_version_t *)0x0) ||
     (__ptr_24->varr == (target_bb_version_t *)0x0)) {
    mir_varr_assert_fail("destroy","target_bb_version_t");
  }
  free(__ptr_24->varr);
  free(__ptr_24);
  __ptr->target_succ_bb_versions = (VARR_target_bb_version_t *)0x0;
  VARR_void_ptr_tdestroy(&__ptr->succ_bb_addrs);
  VARR_spot_attr_tdestroy(&__ptr->spot_attrs);
  VARR_spot_attr_tdestroy(&__ptr->spot2attr);
  do {
    pVVar7 = __ptr->to_free;
    if (pVVar7 == (VARR_void_ptr_t *)0x0) {
      op = "length";
LAB_0012d33f:
      mir_varr_assert_fail(op,"void_ptr_t");
    }
    sVar8 = pVVar7->els_num;
    if (sVar8 == 0) {
      VARR_void_ptr_tdestroy(&__ptr->to_free);
      free(__ptr);
      ctx->gen_ctx = (gen_ctx *)0x0;
      return;
    }
    if (pVVar7->varr == (void_ptr_t *)0x0) {
      op = "pop";
      goto LAB_0012d33f;
    }
    pVVar7->els_num = sVar8 - 1;
    free(pVVar7->varr[sVar8 - 1]);
  } while( true );
}

Assistant:

void MIR_gen_finish (MIR_context_t ctx) {
  gen_ctx_t *gen_ctx_ptr = gen_ctx_loc (ctx), gen_ctx = *gen_ctx_ptr;

  if (gen_ctx == NULL) {
    fprintf (stderr, "Calling MIR_gen_finish before MIR_gen_init -- good bye\n");
    exit (1);
  }
  finish_data_flow (gen_ctx);
  finish_ssa (gen_ctx);
  finish_gvn (gen_ctx);
  finish_live_ranges (gen_ctx);
  finish_coalesce (gen_ctx);
  finish_ra (gen_ctx);
  finish_combine (gen_ctx);
  for (MIR_type_t type = MIR_T_I8; type < MIR_T_BOUND; type++)
    bitmap_destroy (call_used_hard_regs[type]);
  bitmap_destroy (tied_regs);
  bitmap_destroy (addr_regs);
  bitmap_destroy (insn_to_consider);
  bitmap_destroy (func_used_hard_regs);
  target_finish (gen_ctx);
  finish_dead_vars (gen_ctx);
  free (gen_ctx->data_flow_ctx);
  bitmap_destroy (temp_bitmap);
  bitmap_destroy (temp_bitmap2);
  bitmap_destroy (temp_bitmap3);
  VARR_DESTROY (MIR_op_t, temp_ops);
  VARR_DESTROY (MIR_insn_t, temp_insns);
  VARR_DESTROY (MIR_insn_t, temp_insns2);
  VARR_DESTROY (bb_insn_t, temp_bb_insns);
  VARR_DESTROY (bb_insn_t, temp_bb_insns2);
  VARR_DESTROY (loop_node_t, loop_nodes);
  VARR_DESTROY (loop_node_t, queue_nodes);
  VARR_DESTROY (loop_node_t, loop_entries);
  VARR_DESTROY (mem_attr_t, mem_attrs);
  VARR_DESTROY (target_bb_version_t, target_succ_bb_versions);
  VARR_DESTROY (void_ptr_t, succ_bb_addrs);
  VARR_DESTROY (spot_attr_t, spot_attrs);
  VARR_DESTROY (spot_attr_t, spot2attr);
  while (VARR_LENGTH (void_ptr_t, to_free) != 0) free (VARR_POP (void_ptr_t, to_free));
  VARR_DESTROY (void_ptr_t, to_free);
  if (collect_bb_stat_p)
    fprintf (stderr, "Overall bbs num = %llu, generated bbs num = %llu\n", overall_bbs_num,
             overall_gen_bbs_num);
  free (gen_ctx);
  *gen_ctx_ptr = NULL;
}